

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleMeshShape.cpp
# Opt level: O1

void __thiscall cbtTriangleMeshShape::recalcLocalAabb(cbtTriangleMeshShape *this)

{
  float fVar1;
  int i;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 in_XMM1 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  lVar2 = 0;
  do {
    auVar3 = ZEXT816(0) << 0x40;
    local_38 = auVar3;
    *(undefined4 *)(local_38 + lVar2 * 4) = 0x3f800000;
    (*(this->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x11])
              (this,local_38);
    local_28 = vmovlhps_avx(auVar3,in_XMM1);
    fVar1 = *(float *)(local_28 + lVar2 * 4) +
            *(float *)&(this->super_cbtConcaveShape).super_cbtCollisionShape.field_0x1c;
    auVar3 = ZEXT416((uint)fVar1);
    (this->m_localAabbMax).m_floats[lVar2] = fVar1;
    *(undefined4 *)(local_38 + lVar2 * 4) = 0xbf800000;
    (*(this->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x11])
              (this,local_38);
    local_28 = vmovlhps_avx(auVar3,in_XMM1);
    (this->m_localAabbMin).m_floats[lVar2] =
         *(float *)(local_28 + lVar2 * 4) -
         *(float *)&(this->super_cbtConcaveShape).super_cbtCollisionShape.field_0x1c;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return;
}

Assistant:

void cbtTriangleMeshShape::recalcLocalAabb()
{
	for (int i = 0; i < 3; i++)
	{
		cbtVector3 vec(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
		vec[i] = cbtScalar(1.);
		cbtVector3 tmp = localGetSupportingVertex(vec);
		m_localAabbMax[i] = tmp[i] + m_collisionMargin;
		vec[i] = cbtScalar(-1.);
		tmp = localGetSupportingVertex(vec);
		m_localAabbMin[i] = tmp[i] - m_collisionMargin;
	}
}